

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O0

int Gia_ShowCollectObjs_rec
              (Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vAdds,Vec_Int_t *vXors,Vec_Int_t *vMapAdds,
              Vec_Int_t *vMapXors,Vec_Int_t *vOrder)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int iXor;
  int iBox;
  int Level;
  int Level2;
  int Level1;
  int Level0;
  Vec_Int_t *vMapXors_local;
  Vec_Int_t *vMapAdds_local;
  Vec_Int_t *vXors_local;
  Vec_Int_t *vAdds_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iBox = 0;
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjId(p,pObj);
      iVar1 = Vec_IntEntry(vMapAdds,iVar1);
      if (iVar1 < 0) {
        iVar1 = Gia_ObjId(p,pObj);
        iVar1 = Vec_IntEntry(vMapXors,iVar1);
        vAdds_local = (Vec_Int_t *)pObj;
        if (iVar1 < 0) {
          iVar1 = Gia_ObjIsMux(p,pObj);
          if (iVar1 != 0) {
            __assert_fail("!Gia_ObjIsMux(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShow.c"
                          ,0x438,
                          "int Gia_ShowCollectObjs_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          pGVar5 = Gia_ObjFanin0(pObj);
          iVar1 = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          pGVar5 = Gia_ObjFanin1(pObj);
          iVar2 = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          iVar1 = Abc_MaxInt(iVar1,iVar2);
          iXor = iVar1 + 1;
          Gia_ObjSetLevel(p,pObj,iXor);
        }
        else {
          iVar1 = Gia_ObjId(p,pObj);
          iVar1 = Vec_IntEntry(vMapXors,iVar1);
          iVar2 = Vec_IntEntry(vXors,iVar1 * 4 + 1);
          pGVar5 = Gia_ManObj(p,iVar2);
          iVar2 = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          iVar3 = Vec_IntEntry(vXors,iVar1 * 4 + 2);
          pGVar5 = Gia_ManObj(p,iVar3);
          iVar3 = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          iVar4 = Vec_IntEntry(vXors,iVar1 * 4 + 3);
          if (iVar4 != 0) {
            iVar1 = Vec_IntEntry(vXors,iVar1 * 4 + 3);
            pGVar5 = Gia_ManObj(p,iVar1);
            iBox = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          }
          iVar1 = Abc_MaxInt(iVar2,iVar3);
          iVar1 = Abc_MaxInt(iVar1,iBox);
          iXor = iVar1 + 1;
          Gia_ObjSetLevel(p,pObj,iXor);
        }
      }
      else {
        iVar1 = Gia_ObjId(p,pObj);
        iVar1 = Vec_IntEntry(vMapAdds,iVar1);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
        Gia_ObjSetTravIdCurrentId(p,iVar2);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        Gia_ObjSetTravIdCurrentId(p,iVar2);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6);
        pGVar5 = Gia_ManObj(p,iVar2);
        iVar2 = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        iVar3 = Vec_IntEntry(vAdds,iVar1 * 6 + 1);
        pGVar5 = Gia_ManObj(p,iVar3);
        iVar3 = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        iVar4 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
        if (iVar4 != 0) {
          iVar4 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
          pGVar5 = Gia_ManObj(p,iVar4);
          iBox = Gia_ShowCollectObjs_rec(p,pGVar5,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        }
        iVar2 = Abc_MaxInt(iVar2,iVar3);
        iVar2 = Abc_MaxInt(iVar2,iBox);
        iXor = iVar2 + 1;
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
        Gia_ObjSetLevelId(p,iVar2,iXor);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        Gia_ObjSetLevelId(p,iVar2,iXor);
        iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        vAdds_local = (Vec_Int_t *)Gia_ManObj(p,iVar1);
      }
      iVar1 = Gia_ObjId(p,(Gia_Obj_t *)vAdds_local);
      Vec_IntPush(vOrder,iVar1);
      iVar1 = Abc_MaxInt(p->nLevels,iXor);
      p->nLevels = iVar1;
      p_local._4_4_ = iXor;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = Gia_ObjLevel(p,pObj);
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ShowCollectObjs_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vAdds, Vec_Int_t * vXors, Vec_Int_t * vMapAdds, Vec_Int_t * vMapXors, Vec_Int_t * vOrder )
{
    int Level0, Level1, Level2 = 0, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return Gia_ObjLevel(p, pObj);
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Vec_IntEntry(vMapAdds, Gia_ObjId(p, pObj)) >= 0 )
    {
        int iBox = Vec_IntEntry(vMapAdds, Gia_ObjId(p, pObj));
        Gia_ObjSetTravIdCurrentId(p, Vec_IntEntry(vAdds, 6*iBox+3) );
        Gia_ObjSetTravIdCurrentId(p, Vec_IntEntry(vAdds, 6*iBox+4) );
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+0) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+1) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        if ( Vec_IntEntry(vAdds, 6*iBox+2) )
        Level2 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+2) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt( Abc_MaxInt(Level0, Level1), Level2 );
        Gia_ObjSetLevelId( p, Vec_IntEntry(vAdds, 6*iBox+3), Level );
        Gia_ObjSetLevelId( p, Vec_IntEntry(vAdds, 6*iBox+4), Level );
        pObj = Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+4) );
    }
    else if ( Vec_IntEntry(vMapXors, Gia_ObjId(p, pObj)) >= 0 )
    {
        int iXor = Vec_IntEntry(vMapXors, Gia_ObjId(p, pObj));
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+1) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+2) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        if ( Vec_IntEntry(vXors, 4*iXor+3) )
        Level2 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+3) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt( Abc_MaxInt(Level0, Level1), Level2 );
        Gia_ObjSetLevel( p, pObj, Level );
    }
    else
    {
        assert( !Gia_ObjIsMux(p, pObj) );
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ObjFanin0(pObj), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ObjFanin1(pObj), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt(Level0, Level1);
        Gia_ObjSetLevel( p, pObj, Level );
    }
    Vec_IntPush( vOrder, Gia_ObjId(p, pObj) );
    p->nLevels = Abc_MaxInt( p->nLevels, Level );
    return Level;
}